

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmLocalNinjaGenerator.cxx
# Opt level: O0

void __thiscall cmLocalNinjaGenerator::WriteBuildFileTop(cmLocalNinjaGenerator *this)

{
  bool bVar1;
  uint uVar2;
  cmGeneratedFileStream *pcVar3;
  cmGlobalGenerator *pcVar4;
  reference config_00;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *pvVar5;
  const_reference config_01;
  cmGeneratedFileStream *stream;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *config;
  const_iterator __end2;
  const_iterator __begin2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range2;
  cmLocalNinjaGenerator *this_local;
  
  pcVar3 = GetCommonFileStream(this);
  WriteProjectHeader(this,(ostream *)pcVar3);
  pcVar4 = cmLocalGenerator::GetGlobalGenerator((cmLocalGenerator *)this);
  uVar2 = (*pcVar4->_vptr_cmGlobalGenerator[0x26])();
  if ((uVar2 & 1) == 0) {
    pcVar3 = GetCommonFileStream(this);
    WriteNinjaRequiredVersion(this,(ostream *)pcVar3);
    pcVar3 = GetCommonFileStream(this);
    pvVar5 = cmLocalCommonGenerator::GetConfigNames_abi_cxx11_(&this->super_cmLocalCommonGenerator);
    config_01 = std::
                vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::front(pvVar5);
    WriteNinjaConfigurationVariable(this,(ostream *)pcVar3,config_01);
  }
  else {
    pvVar5 = cmLocalCommonGenerator::GetConfigNames_abi_cxx11_(&this->super_cmLocalCommonGenerator);
    __end2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(pvVar5);
    config = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::end(pvVar5);
    while (bVar1 = __gnu_cxx::operator!=
                             (&__end2,(__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                       *)&config), bVar1) {
      config_00 = __gnu_cxx::
                  __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                  ::operator*(&__end2);
      pcVar3 = GetImplFileStream(this,config_00);
      WriteProjectHeader(this,(ostream *)pcVar3);
      WriteNinjaRequiredVersion(this,(ostream *)pcVar3);
      WriteNinjaConfigurationVariable(this,(ostream *)pcVar3,config_00);
      WriteNinjaFilesInclusionConfig(this,(ostream *)pcVar3);
      __gnu_cxx::
      __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
      ::operator++(&__end2);
    }
  }
  pcVar3 = GetCommonFileStream(this);
  WriteNinjaFilesInclusionCommon(this,(ostream *)pcVar3);
  pcVar3 = GetCommonFileStream(this);
  WriteNinjaWorkDir(this,(ostream *)pcVar3);
  pcVar3 = GetRulesFileStream(this);
  WriteProjectHeader(this,(ostream *)pcVar3);
  return;
}

Assistant:

void cmLocalNinjaGenerator::WriteBuildFileTop()
{
  this->WriteProjectHeader(this->GetCommonFileStream());

  if (this->GetGlobalGenerator()->IsMultiConfig()) {
    for (auto const& config : this->GetConfigNames()) {
      auto& stream = this->GetImplFileStream(config);
      this->WriteProjectHeader(stream);
      this->WriteNinjaRequiredVersion(stream);
      this->WriteNinjaConfigurationVariable(stream, config);
      this->WriteNinjaFilesInclusionConfig(stream);
    }
  } else {
    this->WriteNinjaRequiredVersion(this->GetCommonFileStream());
    this->WriteNinjaConfigurationVariable(this->GetCommonFileStream(),
                                          this->GetConfigNames().front());
  }
  this->WriteNinjaFilesInclusionCommon(this->GetCommonFileStream());
  this->WriteNinjaWorkDir(this->GetCommonFileStream());

  // For the rule file.
  this->WriteProjectHeader(this->GetRulesFileStream());
}